

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

void __thiscall
UnicodeFullTest_string_cast_Test<std::pair<char,_char8_t>_>::TestBody
          (UnicodeFullTest_string_cast_Test<std::pair<char,_char8_t>_> *this)

{
  _Alloc_hider _Var1;
  char32_t (*in_RDX) [5];
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *pcVar2;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *pcVar3;
  _Alloc_hider _Var4;
  pointer *__ptr;
  jessilib *this_00;
  pointer *__ptr_1;
  decode_result dVar5;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> rhs;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> rhs_00;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> lhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abcd_str;
  AssertHelper local_90 [8];
  long *local_88;
  byte local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  long *local_70;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  char *extraout_RDX;
  char *extraout_RDX_05;
  
  jessilib::string_cast<char,char32_t[5]>(&local_50,(jessilib *)L"ABCD",in_RDX);
  this_00 = (jessilib *)local_50._M_string_length;
  _Var4._M_p = local_50._M_dataplus._M_p;
  pcVar3 = local_50._M_dataplus._M_p + local_50._M_string_length;
  local_70 = local_60;
  std::__cxx11::u8string::_M_construct<char8_t_const*>
            ((u8string *)&local_70,local_50._M_dataplus._M_p,pcVar3);
  rhs._M_str = (char8_t *)local_70;
  rhs._M_len = (size_t)local_68._M_head_impl;
  lhs._M_str = local_50._M_dataplus._M_p;
  lhs._M_len = local_50._M_string_length;
  local_80[0] = jessilib::equals<char,char8_t>(lhs,rhs);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_70 == local_60) {
    pcVar2 = extraout_RDX;
    if (!(bool)local_80[0]) goto LAB_00206e72;
  }
  else {
    operator_delete(local_70,local_60[0] + 1);
    pcVar2 = extraout_RDX_00;
    if ((local_80[0] & 1) == 0) {
LAB_00206e72:
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)&local_70,(char *)local_80,
                 "equals(abcd_str, string_cast<typename TypeParam::second_type>(abcd_str))","false")
      ;
      testing::internal::AssertHelper::AssertHelper
                (local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                 ,0x9d,(char *)local_70);
      testing::internal::AssertHelper::operator=(local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(local_90);
      pcVar2 = extraout_RDX_01;
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
        pcVar2 = extraout_RDX_02;
      }
      if (local_88 != (long *)0x0) {
        (**(code **)(*local_88 + 8))();
        pcVar2 = extraout_RDX_03;
      }
    }
  }
  _Var1._M_p = local_50._M_dataplus._M_p;
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
    pcVar2 = extraout_RDX_04;
    _Var1._M_p = local_50._M_dataplus._M_p;
  }
  for (; (jessilib *)local_50._M_string_length != (jessilib *)0x0;
      local_50._M_string_length = (size_type)(local_50._M_string_length + -(long)pcVar2)) {
    in_string._M_str = pcVar2;
    in_string._M_len = (size_t)_Var1._M_p;
    dVar5 = jessilib::decode_codepoint_utf8<char>((jessilib *)local_50._M_string_length,in_string);
    pcVar2 = (char *)dVar5.units;
    if (pcVar2 == (char *)0x0) {
      local_80[0] = 0;
      local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)&local_70,(char *)local_80,"is_valid(abcd_str)","false");
      testing::internal::AssertHelper::AssertHelper
                (local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                 ,0x9e,(char *)local_70);
      testing::internal::AssertHelper::operator=(local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(local_90);
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      if (local_88 != (long *)0x0) {
        (**(code **)(*local_88 + 8))();
      }
      if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_78,local_78);
      }
      break;
    }
    _Var1._M_p = _Var1._M_p + (long)pcVar2;
  }
  local_70 = local_60;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)&local_70,_Var4._M_p,pcVar3);
  rhs_00._M_str = (char8_t *)local_70;
  rhs_00._M_len = (size_t)local_68._M_head_impl;
  lhs_00._M_str = _Var4._M_p;
  lhs_00._M_len = (size_t)this_00;
  local_80[0] = jessilib::equals<char,char8_t>(lhs_00,rhs_00);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_70 == local_60) {
    pcVar3 = extraout_RDX_05;
    if ((bool)local_80[0]) goto LAB_002070e6;
  }
  else {
    operator_delete(local_70,local_60[0] + 1);
    pcVar3 = extraout_RDX_06;
    if ((local_80[0] & 1) != 0) goto LAB_002070e6;
  }
  testing::Message::Message((Message *)&local_88);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((AssertionResult *)&local_70,(char *)local_80,
             "equals(abcd_string_view, string_cast<typename TypeParam::second_type>(abcd_string_view))"
             ,"false");
  testing::internal::AssertHelper::AssertHelper
            (local_90,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
             ,0xa1,(char *)local_70);
  testing::internal::AssertHelper::operator=(local_90,(Message *)&local_88);
  testing::internal::AssertHelper::~AssertHelper(local_90);
  pcVar3 = extraout_RDX_07;
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
    pcVar3 = extraout_RDX_08;
  }
  if (local_88 != (long *)0x0) {
    (**(code **)(*local_88 + 8))();
    pcVar3 = extraout_RDX_09;
  }
LAB_002070e6:
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
    pcVar3 = extraout_RDX_10;
  }
  do {
    if (this_00 == (jessilib *)0x0) {
LAB_002071d1:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    in_string_00._M_str = pcVar3;
    in_string_00._M_len = (size_t)_Var4._M_p;
    dVar5 = jessilib::decode_codepoint_utf8<char>(this_00,in_string_00);
    pcVar3 = (char *)dVar5.units;
    if (pcVar3 == (char *)0x0) {
      local_80[0] = 0;
      local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)&local_70,(char *)local_80,"is_valid(abcd_string_view)","false")
      ;
      testing::internal::AssertHelper::AssertHelper
                (local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                 ,0xa2,(char *)local_70);
      testing::internal::AssertHelper::operator=(local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(local_90);
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      if (local_88 != (long *)0x0) {
        (**(code **)(*local_88 + 8))();
      }
      if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_78,local_78);
      }
      goto LAB_002071d1;
    }
    _Var4._M_p = _Var4._M_p + (long)pcVar3;
    this_00 = this_00 + -(long)pcVar3;
  } while( true );
}

Assistant:

TYPED_TEST(UnicodeFullTest, string_cast) {
	auto abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"ABCD");
	std::basic_string_view<typename TypeParam::first_type> abcd_string_view = abcd_str;

	EXPECT_TRUE(equals(abcd_str,
		string_cast<typename TypeParam::second_type>(abcd_str)));
	EXPECT_TRUE(is_valid(abcd_str));

	EXPECT_TRUE(equals(abcd_string_view,
		string_cast<typename TypeParam::second_type>(abcd_string_view)));
	EXPECT_TRUE(is_valid(abcd_string_view));
}